

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O1

Status __thiscall spvtools::opt::AmdExtensionToKhrPass::Process(AmdExtensionToKhrPass *this)

{
  _Rb_tree_header *__position;
  IRContext *pIVar1;
  Module *pMVar2;
  pointer puVar3;
  byte bVar4;
  AmdExtensionToKhrPass *pAVar5;
  _Alloc_node _Var6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var7;
  Pass *pPVar8;
  AmdExtensionToKhrPass *pAVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var10;
  long *plVar11;
  Operand *pOVar12;
  const_iterator cVar13;
  pointer puVar14;
  long lVar15;
  Instruction *pIVar16;
  Instruction *pIVar17;
  Instruction *inst;
  bool changed;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_be_killed;
  InstructionFolder folder;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_to_remove;
  byte local_101;
  AmdExtensionToKhrPass *local_100;
  _Alloc_node local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Stack_f0;
  long local_e8;
  IRContext *local_e0;
  long *local_d8;
  long *local_d0;
  _Any_data local_c8;
  undefined1 local_b8 [16];
  Instruction *local_a8;
  Instruction *local_88 [2];
  _func_int **local_78 [3];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_101 = 0;
  pIVar1 = (this->super_Pass).context_;
  plVar11 = (long *)operator_new(0x90);
  plVar11[1] = (long)(plVar11 + 7);
  plVar11[2] = 1;
  plVar11[3] = 0;
  plVar11[4] = 0;
  *(undefined4 *)(plVar11 + 5) = 0x3f800000;
  plVar11[6] = 0;
  plVar11[7] = 0;
  *(undefined4 *)(plVar11 + 9) = 0;
  plVar11[10] = 0;
  plVar11[0xb] = (long)(plVar11 + 9);
  plVar11[0xc] = (long)(plVar11 + 9);
  plVar11[0xd] = 0;
  plVar11[0xe] = (long)pIVar1;
  plVar11[0xf] = 0;
  plVar11[0x10] = 0;
  plVar11[0x11] = 0;
  *plVar11 = (long)&PTR__FoldingRules_00b1bcd0;
  local_d8 = (long *)operator_new(0x90);
  local_d8[1] = (long)(local_d8 + 7);
  local_d8[2] = 1;
  local_d8[3] = 0;
  local_d8[4] = 0;
  *(undefined4 *)(local_d8 + 5) = 0x3f800000;
  local_d8[6] = 0;
  local_d8[7] = 0;
  *(undefined4 *)(local_d8 + 9) = 0;
  local_d8[10] = 0;
  local_d8[0xb] = (long)(local_d8 + 9);
  local_d8[0xc] = (long)(local_d8 + 9);
  local_d8[0xd] = 0;
  local_d8[0xe] = (long)pIVar1;
  local_d8[0xf] = 0;
  local_d8[0x10] = 0;
  local_d8[0x11] = 0;
  *local_d8 = (long)&PTR__ConstantFoldingRules_00b1bd10;
  local_e0 = pIVar1;
  local_d0 = plVar11;
  (**(code **)(*plVar11 + 0x10))(plVar11);
  (**(code **)(*local_d8 + 0x10))();
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar14 = *(pointer *)
             &(pMVar2->functions_).
              super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              ._M_impl;
  puVar3 = *(pointer *)
            ((long)&(pMVar2->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  local_100 = this;
  if (puVar14 != puVar3) {
    do {
      local_c8._M_unused._M_object = &local_101;
      local_b8._8_8_ =
           std::
           _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp:932:22)>
           ::_M_invoke;
      local_b8._0_8_ =
           std::
           _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp:932:22)>
           ::_M_manager;
      local_c8._8_8_ = &local_e0;
      opt::Function::ForEachInst
                ((Function *)
                 (puVar14->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_c8,false,false);
      if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
        (*(code *)local_b8._0_8_)(&local_c8,&local_c8,3);
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar3);
  }
  local_c8._M_unused._M_object = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SPV_AMD_shader_ballot","");
  local_a8 = (Instruction *)&stack0xffffffffffffff68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"SPV_AMD_shader_trinary_minmax","");
  pIVar17 = (Instruction *)(local_88 + 2);
  local_88[0] = pIVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"SPV_AMD_gcn_shader","");
  __position = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar15 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_t = &local_60;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_60,(const_iterator)__position,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_c8 + lVar15),&local_f8);
    pAVar5 = local_100;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x60);
  lVar15 = -0x60;
  do {
    pIVar16 = pIVar17[-1].dbg_line_insts_.
              super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pIVar17 != pIVar16) {
      operator_delete(pIVar16,(ulong)((long)&(((Instruction *)
                                              (pIVar17->
                                              super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                              _vptr_IntrusiveNodeBase)->
                                             super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                             _vptr_IntrusiveNodeBase + 1));
    }
    pIVar17 = (Instruction *)&pIVar17[-1].dbg_line_insts_;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  local_f8._M_t =
       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  p_Stack_f0 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
  local_e8 = 0;
  pMVar2 = (((pAVar5->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar17 = *(Instruction **)
             ((long)&(pMVar2->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar16 = (Instruction *)
            ((long)&(pMVar2->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (pIVar17 != pIVar16) {
    do {
      if (pIVar17->opcode_ == OpExtension) {
        pOVar12 = Instruction::GetInOperand(pIVar17,0);
        Operand::AsString_abi_cxx11_((string *)&local_c8,pOVar12);
        cVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_60,(key_type *)&local_c8);
        if ((Instruction *)local_c8._M_unused._0_8_ != (Instruction *)local_b8) {
          operator_delete(local_c8._M_unused._M_object,(ulong)(local_b8._0_8_ + 1));
        }
        if ((_Rb_tree_header *)cVar13._M_node != __position) {
          local_c8._M_unused._0_8_ = (undefined8)pIVar17;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_f8,(Instruction **)&local_c8);
        }
      }
      pIVar17 = (pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar17 != pIVar16);
  }
  pMVar2 = (((local_100->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar17 = *(Instruction **)
             ((long)&(pMVar2->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  pIVar16 = (Instruction *)
            ((long)&(pMVar2->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8)
  ;
  bVar4 = local_101;
  pAVar5 = local_100;
  _Var6._M_t = local_f8._M_t;
  p_Var7 = p_Stack_f0;
  if (pIVar17 != pIVar16) {
    do {
      if (pIVar17->opcode_ == OpExtInstImport) {
        pOVar12 = Instruction::GetInOperand(pIVar17,0);
        Operand::AsString_abi_cxx11_((string *)&local_c8,pOVar12);
        cVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_60,(key_type *)&local_c8);
        if ((Instruction *)local_c8._M_unused._0_8_ != (Instruction *)local_b8) {
          operator_delete(local_c8._M_unused._M_object,(ulong)(local_b8._0_8_ + 1));
        }
        if ((_Rb_tree_header *)cVar13._M_node != __position) {
          local_c8._M_unused._0_8_ = (undefined8)pIVar17;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_f8,(Instruction **)&local_c8);
        }
      }
      pIVar17 = (pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      bVar4 = local_101;
      pAVar5 = local_100;
      _Var6._M_t = local_f8._M_t;
      p_Var7 = p_Stack_f0;
    } while (pIVar17 != pIVar16);
  }
  for (; p_Var10 = p_Stack_f0, pAVar9 = local_100, local_101 = bVar4, _Var6._M_t != p_Stack_f0;
      _Var6._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         *)&((_Rb_tree_header *)_Var6._M_t)->_M_header)->super__Rb_tree_header) {
    pPVar8 = &local_100->super_Pass;
    local_100 = pAVar5;
    p_Stack_f0 = p_Var7;
    IRContext::KillInst(pPVar8->context_,
                        *(Instruction **)&((_Rb_tree_header *)_Var6._M_t)->_M_header);
    local_101 = 1;
    bVar4 = local_101;
    pAVar5 = local_100;
    p_Var7 = p_Stack_f0;
    p_Stack_f0 = p_Var10;
    local_100 = pAVar9;
  }
  if ((bVar4 != 0) &&
     (pMVar2 = (((local_100->super_Pass).context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
     (pMVar2->header_).version < 0x10300)) {
    (pMVar2->header_).version = 0x10300;
  }
  local_100 = pAVar5;
  p_Stack_f0 = p_Var7;
  if ((_Rb_tree_header *)local_f8._M_t != (_Rb_tree_header *)0x0) {
    operator_delete(local_f8._M_t,local_e8 - (long)local_f8._M_t);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_d0 != (long *)0x0) {
    (**(code **)(*local_d0 + 8))();
  }
  local_d0 = (long *)0x0;
  if (local_d8 != (long *)0x0) {
    (**(code **)(*local_d8 + 8))();
  }
  return bVar4 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status AmdExtensionToKhrPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<AmdExtFoldingRules>(new AmdExtFoldingRules(context())),
      MakeUnique<AmdExtConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  // Now that instruction that require the extensions have been removed, we can
  // remove the extension instructions.
  std::set<std::string> ext_to_remove = {"SPV_AMD_shader_ballot",
                                         "SPV_AMD_shader_trinary_minmax",
                                         "SPV_AMD_gcn_shader"};

  std::vector<Instruction*> to_be_killed;
  for (Instruction& inst : context()->module()->extensions()) {
    if (inst.opcode() == spv::Op::OpExtension) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction& inst : context()->ext_inst_imports()) {
    if (inst.opcode() == spv::Op::OpExtInstImport) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction* inst : to_be_killed) {
    context()->KillInst(inst);
    changed = true;
  }

  // The replacements that take place use instructions that are missing before
  // SPIR-V 1.3. If we changed something, we will have to make sure the version
  // is at least SPIR-V 1.3 to make sure those instruction can be used.
  if (changed) {
    uint32_t version = get_module()->version();
    if (version < 0x00010300 /*1.3*/) {
      get_module()->set_version(0x00010300);
    }
  }
  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}